

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

TypedDeleter<LLVMBC::LoadInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::LoadInst>,LLVMBC::LoadInst*&>
          (LLVMContext *this,LoadInst **u)

{
  LoadInst *pLVar1;
  TypedDeleter<LLVMBC::LoadInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::LoadInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::LoadInst> *)0x0) {
    pLVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f8900;
    pTVar2->ptr = pLVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}